

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlineedit.cpp
# Opt level: O0

void QLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorage<Qt::AlignmentFlag> *pQVar1;
  bool bVar2;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar3;
  QFlagsStorage<Qt::AlignmentFlag> QVar4;
  ulong uVar5;
  QString *text;
  QtMocHelpers *in_RCX;
  EVP_PKEY_CTX *in_RDX;
  int iVar6;
  EVP_PKEY_CTX *in_RSI;
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QLineEdit *_t;
  QVariant _r;
  QString *in_stack_fffffffffffffe68;
  QLineEdit *in_stack_fffffffffffffe70;
  QLineEdit *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffe88;
  EchoMode mode;
  undefined8 in_stack_fffffffffffffec0;
  undefined1 enable;
  QLineEdit *in_stack_fffffffffffffec8;
  QVariant *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  InputMethodQuery property;
  QLineEdit *this;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  mode = (EchoMode)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  enable = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
  property = (InputMethodQuery)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (int)in_RSI;
  if (iVar6 == 0) {
    uVar5 = (ulong)in_RDX & 0xffffffff;
    switch(uVar5) {
    case 0:
      textChanged(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      break;
    case 1:
      textEdited(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      break;
    case 2:
      cursorPositionChanged
                ((QLineEdit *)0x5cace9,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 (int)in_stack_fffffffffffffe68);
      break;
    case 3:
      returnPressed((QLineEdit *)0x5cacfb);
      break;
    case 4:
      editingFinished((QLineEdit *)0x5cad0d);
      break;
    case 5:
      selectionChanged((QLineEdit *)0x5cad1f);
      break;
    case 6:
      inputRejected((QLineEdit *)0x5cad31);
      break;
    case 7:
      setText(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      break;
    case 8:
      clear(in_stack_fffffffffffffe70);
      break;
    case 9:
      selectAll(in_stack_fffffffffffffe70);
      break;
    case 10:
      undo(in_stack_fffffffffffffe70);
      break;
    case 0xb:
      redo(in_stack_fffffffffffffe70);
      break;
    case 0xc:
      cut(in_stack_fffffffffffffe70);
      break;
    case 0xd:
      copy(in_RDI,in_RSI,in_RDX);
      break;
    case 0xe:
      paste(in_stack_fffffffffffffe70);
      break;
    case 0xf:
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffe84 = **(undefined4 **)(in_RCX + 8);
      this = in_RDI;
      ::QVariant::QVariant(&local_48,*(QVariant **)(in_RCX + 0x10));
      inputMethodQuery(this,property,in_stack_ffffffffffffff00);
      ::QVariant::~QVariant(&local_48);
      in_stack_fffffffffffffe78 = in_RDI;
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=((QVariant *)in_RDI,(QVariant *)in_stack_fffffffffffffe70);
        in_stack_fffffffffffffe78 = in_RDI;
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
    }
    mode = (EchoMode)(uVar5 >> 0x20);
  }
  if (iVar6 == 5) {
    bVar2 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)(QString_const&)>
                      (in_RCX,(void **)textChanged,0,0);
    if ((((bVar2) ||
         (bVar2 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)(QString_const&)>
                            (in_RCX,(void **)textEdited,0,1), bVar2)) ||
        (bVar2 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)(int,int)>
                           (in_RCX,(void **)cursorPositionChanged,0,2), bVar2)) ||
       (bVar2 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)()>(in_RCX,(void **)returnPressed,0,3)
       , bVar2)) goto LAB_005cb519;
    enable = 0;
    in_stack_fffffffffffffec8 = (QLineEdit *)0x0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)()>(in_RCX,(void **)editingFinished,0,4);
    if (((bVar2) ||
        (bVar2 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)()>
                           (in_RCX,(void **)selectionChanged,0,5), bVar2)) ||
       (bVar2 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)()>(in_RCX,(void **)inputRejected,0,6)
       , bVar2)) goto LAB_005cb519;
  }
  if (iVar6 == 1) {
    pQVar1 = *(QFlagsStorage<Qt::AlignmentFlag> **)in_RCX;
    in_stack_fffffffffffffe70 = (QLineEdit *)((ulong)in_RDX & 0xffffffff);
    switch(in_stack_fffffffffffffe70) {
    case (QLineEdit *)0x0:
      inputMask(in_stack_fffffffffffffe78);
      QString::operator=((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      QString::~QString((QString *)0x5cb0f7);
      break;
    case (QLineEdit *)0x1:
      QLineEdit::text(in_stack_fffffffffffffe78);
      QString::operator=((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      QString::~QString((QString *)0x5cb130);
      break;
    case (QLineEdit *)0x2:
      QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)maxLength(in_stack_fffffffffffffe70);
      pQVar1->i = (Int)QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i;
      break;
    case (QLineEdit *)0x3:
      bVar2 = hasFrame(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
      break;
    case (QLineEdit *)0x4:
      QVar4.i = echoMode(in_stack_fffffffffffffe70);
      pQVar1->i = QVar4.i;
      break;
    case (QLineEdit *)0x5:
      displayText(in_stack_fffffffffffffe78);
      QString::operator=((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      QString::~QString((QString *)0x5cb1bd);
      break;
    case (QLineEdit *)0x6:
      QVar4.i = cursorPosition(in_stack_fffffffffffffe70);
      pQVar1->i = QVar4.i;
      break;
    case (QLineEdit *)0x7:
      QVar4.i = (Int)alignment(in_stack_fffffffffffffe70);
      pQVar1->i = QVar4.i;
      break;
    case (QLineEdit *)0x8:
      bVar2 = isModified(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
      break;
    case (QLineEdit *)0x9:
      bVar2 = hasSelectedText(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
      break;
    case (QLineEdit *)0xa:
      selectedText(in_stack_fffffffffffffe78);
      QString::operator=((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      QString::~QString((QString *)0x5cb274);
      break;
    case (QLineEdit *)0xb:
      bVar2 = dragEnabled(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
      break;
    case (QLineEdit *)0xc:
      bVar2 = isReadOnly(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
      break;
    case (QLineEdit *)0xd:
      bVar2 = isUndoAvailable(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
      break;
    case (QLineEdit *)0xe:
      bVar2 = isRedoAvailable(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
      break;
    case (QLineEdit *)0xf:
      bVar2 = hasAcceptableInput(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
      break;
    case (QLineEdit *)0x10:
      placeholderText(in_stack_fffffffffffffe78);
      QString::operator=((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      QString::~QString((QString *)0x5cb340);
      break;
    case (QLineEdit *)0x11:
      QVar4.i = cursorMoveStyle(in_stack_fffffffffffffe70);
      pQVar1->i = QVar4.i;
      break;
    case (QLineEdit *)0x12:
      bVar2 = isClearButtonEnabled(in_stack_fffffffffffffe70);
      *(bool *)&pQVar1->i = bVar2;
    }
  }
  if (iVar6 == 2) {
    text = (QString *)((ulong)in_RDX & 0xffffffff);
    switch(text) {
    case (QString *)0x0:
      setInputMask(in_stack_fffffffffffffe70,text);
      break;
    case (QString *)0x1:
      setText(in_stack_fffffffffffffe70,text);
      break;
    case (QString *)0x2:
      setMaxLength(in_stack_fffffffffffffe70,0);
      break;
    case (QString *)0x3:
      setFrame((QLineEdit *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               SUB81((ulong)in_stack_fffffffffffffe78 >> 0x38,0));
      break;
    case (QString *)0x4:
      setEchoMode(*(QLineEdit **)in_RCX,mode);
      break;
    default:
      break;
    case (QString *)0x6:
      setCursorPosition(in_stack_fffffffffffffe70,0);
      break;
    case (QString *)0x7:
      setAlignment(in_stack_fffffffffffffe70,
                   (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                   SUB84((ulong)in_stack_fffffffffffffe78 >> 0x20,0));
      break;
    case (QString *)0x8:
      setModified(in_stack_fffffffffffffe70,false);
      break;
    case (QString *)0xb:
      setDragEnabled(in_stack_fffffffffffffe70,false);
      break;
    case (QString *)0xc:
      setReadOnly(in_stack_fffffffffffffe78,SUB81((ulong)in_stack_fffffffffffffe70 >> 0x38,0));
      break;
    case (QString *)0x10:
      setPlaceholderText((QLineEdit *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QString *)in_stack_fffffffffffffe78);
      break;
    case (QString *)0x11:
      setCursorMoveStyle(in_stack_fffffffffffffe70,LogicalMoveStyle);
      break;
    case (QString *)0x12:
      setClearButtonEnabled(in_stack_fffffffffffffec8,(bool)enable);
    }
  }
LAB_005cb519:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLineEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->textEdited((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->cursorPositionChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->returnPressed(); break;
        case 4: _t->editingFinished(); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->inputRejected(); break;
        case 7: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->clear(); break;
        case 9: _t->selectAll(); break;
        case 10: _t->undo(); break;
        case 11: _t->redo(); break;
        case 12: _t->cut(); break;
        case 13: _t->copy(); break;
        case 14: _t->paste(); break;
        case 15: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(const QString & )>(_a, &QLineEdit::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(const QString & )>(_a, &QLineEdit::textEdited, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(int , int )>(_a, &QLineEdit::cursorPositionChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::returnPressed, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::editingFinished, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::inputRejected, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->inputMask(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->maxLength(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 4: *reinterpret_cast<EchoMode*>(_v) = _t->echoMode(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->displayText(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->cursorPosition(); break;
        case 7: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isModified(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->hasSelectedText(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->selectedText(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->dragEnabled(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->isUndoAvailable(); break;
        case 14: *reinterpret_cast<bool*>(_v) = _t->isRedoAvailable(); break;
        case 15: *reinterpret_cast<bool*>(_v) = _t->hasAcceptableInput(); break;
        case 16: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        case 17: *reinterpret_cast<Qt::CursorMoveStyle*>(_v) = _t->cursorMoveStyle(); break;
        case 18: *reinterpret_cast<bool*>(_v) = _t->isClearButtonEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setInputMask(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 2: _t->setMaxLength(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setEchoMode(*reinterpret_cast<EchoMode*>(_v)); break;
        case 6: _t->setCursorPosition(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 8: _t->setModified(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setDragEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 16: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        case 17: _t->setCursorMoveStyle(*reinterpret_cast<Qt::CursorMoveStyle*>(_v)); break;
        case 18: _t->setClearButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}